

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_1.h
# Opt level: O1

bool __thiscall
dlib::
binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
::keep_node_balanced
          (binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
           *this,node **t)

{
  node *pnVar1;
  node *pnVar2;
  node *temp;
  char cVar3;
  node *pnVar4;
  
  pnVar1 = *t;
  cVar3 = pnVar1->balance;
  if (cVar3 == '\0') {
    return false;
  }
  if (cVar3 == -2) {
    pnVar4 = pnVar1->left;
    cVar3 = pnVar4->balance;
    if ('\0' < cVar3) {
      pnVar4 = pnVar4->right;
      *t = pnVar4;
      pnVar2 = pnVar1->left;
      pnVar2->right = pnVar4->left;
      (*t)->left = pnVar2;
      pnVar1->left = (*t)->right;
      (*t)->right = pnVar1;
LAB_0023dab4:
      pnVar1 = *t;
      if (pnVar1->balance < '\0') {
        pnVar1->left->balance = '\0';
        cVar3 = '\x01';
      }
      else {
        if (pnVar1->balance == '\0') {
          pnVar1->left->balance = '\0';
        }
        else {
          pnVar1->left->balance = -1;
        }
        cVar3 = '\0';
      }
      pnVar1->right->balance = cVar3;
      pnVar1->balance = '\0';
      goto LAB_0023dae4;
    }
    pnVar1->balance = -(cVar3 != -1);
    pnVar4->balance = cVar3 != -1;
    pnVar1->left = pnVar4->right;
    pnVar4->right = *t;
  }
  else {
    if (cVar3 != '\x02') goto LAB_0023dae4;
    pnVar4 = pnVar1->right;
    cVar3 = pnVar4->balance;
    if (cVar3 < '\0') {
      pnVar4 = pnVar4->left;
      *t = pnVar4;
      pnVar2 = pnVar1->right;
      pnVar2->left = pnVar4->right;
      (*t)->right = pnVar2;
      pnVar1->right = (*t)->left;
      (*t)->left = pnVar1;
      goto LAB_0023dab4;
    }
    pnVar1->balance = cVar3 != '\x01';
    pnVar4->balance = -(cVar3 != '\x01');
    pnVar1->right = pnVar4->left;
    pnVar4->left = *t;
  }
  *t = pnVar4;
LAB_0023dae4:
  return (*t)->balance == '\0';
}

Assistant:

bool binary_search_tree_kernel_1<domain,range,mem_manager,compare>::
    keep_node_balanced (
        node*& t
    )
    {
        // make a reference to the current node so we don't have to dereference 
        // a pointer a bunch of times
        node& tree = *t;
 
        // if tree does not need to be balanced then return false
        if (tree.balance == 0)
            return false;


        // if tree needs to be rotated left
        if (tree.balance == 2)
        {
            if (tree.right->balance >= 0)
                rotate_left(t);
            else
                double_rotate_left(t);
        }
        // else if the tree needs to be rotated right
        else if (tree.balance == -2)
        {
            if (tree.left->balance <= 0)
                rotate_right(t);
            else
                double_rotate_right(t);
        }
   

        if (t->balance == 0)
            return true;
        else
            return false; 
    }